

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::CBString(CBString *this,CBStringList *l)

{
  int *piVar1;
  uchar *puVar2;
  CBStringException *this_00;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  CBStringException bstr__cppwrapper_exception;
  string local_70;
  CBStringException local_50;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_001a9830;
  lVar3 = *(long *)(l + 8) - *(long *)l;
  if (lVar3 == 0) {
    iVar4 = 1;
  }
  else {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    piVar1 = (int *)(*(long *)l + 0xc);
    iVar4 = 1;
    do {
      iVar4 = iVar4 + *piVar1;
      piVar1 = piVar1 + 6;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  (this->super_tagbstring).mlen = iVar4;
  (this->super_tagbstring).slen = 0;
  puVar2 = (uchar *)malloc((long)iVar4);
  (this->super_tagbstring).data = puVar2;
  if (puVar2 == (uchar *)0x0) {
    (this->super_tagbstring).mlen = 0;
    (this->super_tagbstring).slen = 0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CBString::Failure in (CBStringList) constructor","");
    CBStringException::CBStringException(&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,&local_50);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  lVar3 = *(long *)l;
  if (*(long *)(l + 8) != lVar3) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      operator+=(this,(CBString *)(lVar3 + lVar5));
      uVar6 = uVar6 + 1;
      lVar3 = *(long *)l;
      lVar5 = lVar5 + 0x18;
    } while (uVar6 < (ulong)((*(long *)(l + 8) - lVar3 >> 3) * -0x5555555555555555));
  }
  return;
}

Assistant:

CBString::CBString (const CBStringList& l) {
int c;
size_t i;

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen;
	}

	mlen = c;
	slen = 0;
	data = (unsigned char *) bstr__alloc (c);
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			*this += l.at(i);
		}
	}
}